

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLESelect<duckdb::hugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  data_ptr_t pdVar1;
  uint64_t uVar2;
  RLEScanState<duckdb::hugeint_t> *scan_state;
  idx_t iVar3;
  idx_t iVar4;
  InternalException *this;
  ulong uVar5;
  idx_t iVar6;
  hugeint_t *data_pointer;
  idx_t iVar7;
  ulong uVar8;
  rle_count_t *index_pointer;
  string local_50;
  
  scan_state = (RLEScanState<duckdb::hugeint_t> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar1 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (hugeint_t *)(pdVar1 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar1 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((vector_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<duckdb::hugeint_t>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar1 = result->data;
  iVar4 = 0;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (sel_count != 0) {
    iVar3 = 0;
    uVar8 = 0;
    do {
      iVar4 = iVar3;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)sel->sel_vector[iVar3];
      }
      uVar5 = iVar4 - uVar8;
      if (iVar4 < uVar8) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Error in RLESelect - selection vector indices are not ordered","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (uVar5 != 0) {
        iVar6 = scan_state->entry_pos;
        iVar7 = scan_state->position_in_entry;
        do {
          uVar8 = index_pointer[iVar6] - iVar7;
          if (uVar5 < uVar8) {
            uVar8 = uVar5;
          }
          iVar7 = iVar7 + uVar8;
          if (index_pointer[iVar6] <= iVar7) {
            iVar6 = iVar6 + 1;
            scan_state->entry_pos = iVar6;
            iVar7 = 0;
          }
          uVar5 = uVar5 - uVar8;
        } while (uVar5 != 0);
        scan_state->position_in_entry = iVar7;
      }
      uVar2 = data_pointer[scan_state->entry_pos].upper;
      *(uint64_t *)(pdVar1 + iVar3 * 0x10) = data_pointer[scan_state->entry_pos].lower;
      *(uint64_t *)((long)(pdVar1 + iVar3 * 0x10) + 8) = uVar2;
      iVar3 = iVar3 + 1;
      uVar8 = iVar4;
    } while (iVar3 != sel_count);
  }
  uVar8 = vector_count - iVar4;
  if (uVar8 != 0) {
    iVar4 = scan_state->entry_pos;
    iVar3 = scan_state->position_in_entry;
    do {
      uVar5 = index_pointer[iVar4] - iVar3;
      if (uVar8 < uVar5) {
        uVar5 = uVar8;
      }
      iVar3 = iVar3 + uVar5;
      if (index_pointer[iVar4] <= iVar3) {
        iVar4 = iVar4 + 1;
        scan_state->entry_pos = iVar4;
        iVar3 = 0;
      }
      uVar8 = uVar8 - uVar5;
    } while (uVar8 != 0);
    scan_state->position_in_entry = iVar3;
  }
  return;
}

Assistant:

void RLESelect(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
               const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run we don't need to select at all
	if (CanEmitConstantVector<true>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos], vector_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, vector_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t prev_idx = 0;
	for (idx_t i = 0; i < sel_count; i++) {
		auto next_idx = sel.get_index(i);
		if (next_idx < prev_idx) {
			throw InternalException("Error in RLESelect - selection vector indices are not ordered");
		}
		// skip forward to the next index
		scan_state.SkipInternal(index_pointer, next_idx - prev_idx);
		// read the element
		result_data[i] = data_pointer[scan_state.entry_pos];
		// move the next to the prev
		prev_idx = next_idx;
	}
	// skip the tail
	scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
}